

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O0

size_t __thiscall
frozen::bits::pmh_tables<4ul,frozen::elsa<unsigned_int>>::lookup<int,frozen::elsa<unsigned_int>>
          (pmh_tables<4ul,frozen::elsa<unsigned_int>> *this,int *key,elsa<unsigned_int> *hasher)

{
  value_type this_00;
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  value_type seed;
  const_reference pvVar4;
  uint local_38;
  uint local_34;
  seed_or_index local_30;
  value_type d;
  elsa<unsigned_int> *hasher_local;
  int *key_local;
  pmh_tables<4UL,_frozen::elsa<unsigned_int>_> *this_local;
  
  local_34 = *key;
  d.value_ = (value_type)hasher;
  sVar2 = elsa<unsigned_int>::operator()(hasher,&local_34,*(size_t *)this);
  pvVar3 = carray<frozen::bits::seed_or_index,_4UL>::operator[]
                     ((carray<frozen::bits::seed_or_index,_4UL> *)(this + 8),sVar2 & 3);
  local_30.value_ = pvVar3->value_;
  bVar1 = seed_or_index::is_seed(&local_30);
  this_00 = d;
  if (bVar1) {
    local_38 = *key;
    seed = seed_or_index::value(&local_30);
    sVar2 = elsa<unsigned_int>::operator()((elsa<unsigned_int> *)this_00.value_,&local_38,seed);
    pvVar4 = carray<unsigned_long,_4UL>::operator[]
                       ((carray<unsigned_long,_4UL> *)(this + 0x28),sVar2 & 3);
    this_local = (pmh_tables<4UL,_frozen::elsa<unsigned_int>_> *)*pvVar4;
  }
  else {
    this_local = (pmh_tables<4UL,_frozen::elsa<unsigned_int>_> *)seed_or_index::value(&local_30);
  }
  return (size_t)this_local;
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }